

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<cmCoreTryCompile::Arguments> * __thiscall
cmArgumentParser<cmCoreTryCompile::Arguments>::Bind
          (cmArgumentParser<cmCoreTryCompile::Arguments> *this,static_string_view name,
          offset_in_Arguments_to_subr member,ExpectAtLeast expect)

{
  string_view name_00;
  anon_class_24_2_a47a4ba1 local_90;
  KeywordAction local_78;
  size_t local_58;
  char *pcStack_50;
  offset_in_Arguments_to_subr local_48;
  offset_in_Arguments_to_subr member_local;
  cmArgumentParser<cmCoreTryCompile::Arguments> *local_38;
  cmArgumentParser<cmCoreTryCompile::Arguments> *this_local;
  ExpectAtLeast expect_local;
  static_string_view name_local;
  
  pcStack_50 = name.super_string_view._M_str;
  local_58 = name.super_string_view._M_len;
  local_90.member = member;
  local_90._8_8_ = expect.Count;
  local_48 = member;
  member_local = expect.Count;
  local_38 = this;
  expect_local.Count = member;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<cmCoreTryCompile::Arguments>::Bind(cm::static_string_view,ArgumentParser::Continue(cmCoreTryCompile::Arguments::*)(std::basic_string_view<char,std::char_traits<char>>),ArgumentParser::ExpectAtLeast)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&local_78,&local_90);
  name_00._M_str = pcStack_50;
  name_00._M_len = local_58;
  ArgumentParser::Base::Bind(&this->super_Base,name_00,&local_78);
  std::function<void_(ArgumentParser::Instance_&)>::~function(&local_78);
  return this;
}

Assistant:

cmArgumentParser& Bind(cm::static_string_view name,
                         Continue (Result::*member)(cm::string_view),
                         ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [member, expect](Instance& instance) {
      Result* result = static_cast<Result*>(instance.Result);
      instance.Bind(
        [result, member](cm::string_view arg) -> Continue {
          return (result->*member)(arg);
        },
        expect);
    });
    return *this;
  }